

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O2

pair<QRBTree<int>::Node_*,_QRBTree<int>::Node_*> __thiscall
QTriangulator<unsigned_int>::ComplexToSimple::outerBounds(ComplexToSimple *this,QPodPoint *point)

{
  int iVar1;
  QTriangulator<unsigned_int> *pQVar2;
  Edge *pEVar3;
  Node *pNVar4;
  QPodPoint *pQVar5;
  Node *pNVar6;
  QRBTree<int> *pQVar7;
  qint64 qVar8;
  Node *pNVar9;
  Node **ppNVar10;
  Node *pNVar11;
  pair<QRBTree<int>::Node_*,_QRBTree<int>::Node_*> pVar12;
  
  pQVar2 = this->m_parent;
  pEVar3 = (this->m_edges).buffer;
  pNVar9 = (Node *)0x0;
  pNVar11 = (Node *)0x0;
  pQVar7 = &this->m_edgeList;
  while (pNVar4 = pQVar7->root, pNVar4 != (Node *)0x0) {
    iVar1 = pNVar4->data;
    pQVar5 = (pQVar2->m_vertices).buffer;
    qVar8 = qPointDistanceFromLine
                      (point,pQVar5 + (&pEVar3[iVar1].from)[pEVar3[iVar1].pointingUp ^ 1],
                       pQVar5 + (&pEVar3[iVar1].from)[pEVar3[iVar1].pointingUp]);
    pNVar6 = pNVar4;
    if (qVar8 == 0) goto LAB_003e5081;
    if (-1 < qVar8) {
      pNVar11 = pNVar4;
      pNVar6 = pNVar9;
    }
    pNVar9 = pNVar6;
    pQVar7 = (QRBTree<int> *)(&pNVar4->left + (-1 < qVar8));
  }
LAB_003e5140:
  pVar12.second = pNVar9;
  pVar12.first = pNVar11;
  return pVar12;
LAB_003e5081:
  for (; pNVar6 = pNVar6->left, pNVar6 != (Node *)0x0;
      pNVar6 = (Node *)(&pNVar6->data + (ulong)(qVar8 != 0) * 2)) {
    iVar1 = pNVar6->data;
    qVar8 = qPointDistanceFromLine
                      (point,pQVar5 + (&pEVar3[iVar1].from)[pEVar3[iVar1].pointingUp ^ 1],
                       pQVar5 + (&pEVar3[iVar1].from)[pEVar3[iVar1].pointingUp]);
    if (qVar8 != 0) {
      pNVar11 = pNVar6;
    }
  }
  ppNVar10 = &pNVar4->right;
  while (pNVar4 = *ppNVar10, pNVar4 != (Node *)0x0) {
    iVar1 = pNVar4->data;
    qVar8 = qPointDistanceFromLine
                      (point,pQVar5 + (&pEVar3[iVar1].from)[pEVar3[iVar1].pointingUp ^ 1],
                       pQVar5 + (&pEVar3[iVar1].from)[pEVar3[iVar1].pointingUp]);
    if (qVar8 != 0) {
      pNVar9 = pNVar4;
    }
    ppNVar10 = &pNVar4->left + (qVar8 == 0);
  }
  goto LAB_003e5140;
}

Assistant:

std::pair<QRBTree<int>::Node *, QRBTree<int>::Node *> QTriangulator<T>::ComplexToSimple::outerBounds(const QPodPoint &point) const
{
    QRBTree<int>::Node *current = m_edgeList.root;
    std::pair<QRBTree<int>::Node *, QRBTree<int>::Node *> result(nullptr, nullptr);

    while (current) {
        const QPodPoint &v1 = m_parent->m_vertices.at(m_edges.at(current->data).lower());
        const QPodPoint &v2 = m_parent->m_vertices.at(m_edges.at(current->data).upper());
        qint64 d = QT_PREPEND_NAMESPACE(qPointDistanceFromLine)(point, v1, v2);
        if (d == 0)
            break;
        if (d < 0) {
            result.second = current;
            current = current->left;
        } else {
            result.first = current;
            current = current->right;
        }
    }

    if (!current)
        return result;

    QRBTree<int>::Node *mid = current;

    current = mid->left;
    while (current) {
        const QPodPoint &v1 = m_parent->m_vertices.at(m_edges.at(current->data).lower());
        const QPodPoint &v2 = m_parent->m_vertices.at(m_edges.at(current->data).upper());
        qint64 d = QT_PREPEND_NAMESPACE(qPointDistanceFromLine)(point, v1, v2);
        Q_ASSERT(d >= 0);
        if (d == 0) {
            current = current->left;
        } else {
            result.first = current;
            current = current->right;
        }
    }

    current = mid->right;
    while (current) {
        const QPodPoint &v1 = m_parent->m_vertices.at(m_edges.at(current->data).lower());
        const QPodPoint &v2 = m_parent->m_vertices.at(m_edges.at(current->data).upper());
        qint64 d = QT_PREPEND_NAMESPACE(qPointDistanceFromLine)(point, v1, v2);
        Q_ASSERT(d <= 0);
        if (d == 0) {
            current = current->right;
        } else {
            result.second = current;
            current = current->left;
        }
    }

    return result;
}